

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O1

DdNode * GetSingleOutputFunctionRemappedNewDD
                   (DdManager *dd,DdNode **pOutputs,int nOuts,DdManager **DdNew)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdManager *ddDestination;
  int iVar6;
  DdNode *pDVar7;
  ulong uVar8;
  DdNode **ppDVar9;
  uint uVar10;
  DdManager *ddSource;
  long lVar11;
  
  if (nOuts < 1) {
    iVar6 = 0;
  }
  else {
    uVar8 = 0;
    iVar6 = 0;
    do {
      pDVar4 = Cudd_Support(dd,pOutputs[uVar8]);
      Cudd_Ref(pDVar4);
      pDVar5 = dd->one;
      lVar11 = 0;
      if (pDVar4 != pDVar5) {
        piVar2 = dd->invperm;
        lVar11 = 0;
        pDVar7 = pDVar4;
        do {
          piVar1 = piVar2 + lVar11;
          lVar11 = lVar11 + 1;
          GetSingleOutputFunctionRemappedNewDD::Permute[pDVar7->index] = *piVar1;
          pDVar7 = (pDVar7->type).kids.T;
        } while (pDVar7 != pDVar5);
      }
      pDVar5 = Cudd_bddPermute(dd,pOutputs[uVar8],GetSingleOutputFunctionRemappedNewDD::Permute);
      GetSingleOutputFunctionRemappedNewDD::pRemapped[uVar8] = pDVar5;
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar4);
      if (iVar6 <= (int)lVar11) {
        iVar6 = (int)lVar11;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nOuts);
  }
  uVar3 = nOuts;
  if (1 < (uint)nOuts) {
    uVar3 = nOuts - 1;
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar10 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar3 = (uVar10 ^ 0xffffffe0) + 0x21;
    }
  }
  if (uVar3 != 0) {
    ppDVar9 = GetSingleOutputFunctionRemappedNewDD::pbVarsEnc;
    uVar8 = 0;
    do {
      pDVar5 = Cudd_bddNewVarAtLevel(dd,(int)uVar8);
      *ppDVar9 = pDVar5;
      uVar8 = uVar8 + 1;
      ppDVar9 = ppDVar9 + 1;
    } while (uVar3 != uVar8);
  }
  pDVar5 = Extra_bddEncodingBinary
                     (dd,GetSingleOutputFunctionRemappedNewDD::pRemapped,nOuts,
                      GetSingleOutputFunctionRemappedNewDD::pbVarsEnc,uVar3);
  Cudd_Ref(pDVar5);
  uVar10 = iVar6 + uVar3;
  if (uVar10 != 0 && SCARRY4(iVar6,uVar3) == (int)uVar10 < 0) {
    piVar2 = dd->invperm;
    uVar8 = 0;
    do {
      GetSingleOutputFunctionRemappedNewDD::Permute[piVar2[uVar8]] = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  ddDestination = Cudd_Init(uVar10,0,0x100,0x40000,0);
  ddSource = dd;
  Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  pDVar4 = Cudd_bddTransferPermute
                     (ddSource,ddDestination,pDVar5,GetSingleOutputFunctionRemappedNewDD::Permute);
  Cudd_Ref(pDVar4);
  Cudd_RecursiveDeref(dd,pDVar5);
  if (0 < nOuts) {
    lVar11 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)
                              ((long)GetSingleOutputFunctionRemappedNewDD::pRemapped + lVar11));
      lVar11 = lVar11 + 8;
    } while ((ulong)(uint)nOuts << 3 != lVar11);
  }
  pDVar5 = Cudd_BddToAdd(ddDestination,pDVar4);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(ddDestination,pDVar4);
  *DdNew = ddDestination;
  Cudd_Deref(pDVar5);
  return pDVar5;
}

Assistant:

DdNode * GetSingleOutputFunctionRemappedNewDD( DdManager * dd, DdNode ** pOutputs, int nOuts, DdManager ** DdNew )
// returns the ADD of the remapped function
{
    static int Permute[MAXINPUTS];
    static DdNode * pRemapped[MAXOUTPUTS];

    static DdNode * pbVarsEnc[MAXINPUTS];
    int nVarsEnc;

    DdManager * ddnew;

    DdNode * bSupp, * bTemp;
    int i, v, Counter;
    DdNode * bFunc;

    // these are in the new manager
    DdNode * bFuncNew;
    DdNode * aFuncNew;

    int nVarsMax = 0;

    // perform the remapping and write the DDs into the new manager
    for ( i = 0; i < nOuts; i++ )
    {
        // get support
        bSupp = Cudd_Support( dd, pOutputs[i] );    Cudd_Ref( bSupp );

        // create the variable map
        // to remap the DD into the upper part of the manager
        Counter = 0;
        for ( bTemp = bSupp; bTemp != dd->one; bTemp = cuddT(bTemp) )
            Permute[bTemp->index] = dd->invperm[Counter++];

        // transfer the BDD and remap it
        pRemapped[i] = Cudd_bddPermute( dd, pOutputs[i], Permute );  Cudd_Ref( pRemapped[i] );

        // remove support
        Cudd_RecursiveDeref( dd, bSupp );


        // determine the largest support size
        if ( nVarsMax < Counter )
            nVarsMax = Counter;
    }
    
    // select the encoding variables to follow immediately after the original variables
    nVarsEnc = Abc_Base2Log(nOuts);
/*
    for ( v = 0; v < nVarsEnc; v++ )
        if ( nVarsMax + v < dd->size )
            pbVarsEnc[v] = dd->var[ dd->invperm[nVarsMax+v] ];
        else
            pbVarsEnc[v] = Cudd_bddNewVar( dd );
*/
    // create the new variables on top of the manager
    for ( v = 0; v < nVarsEnc; v++ )
        pbVarsEnc[v] = Cudd_bddNewVarAtLevel( dd, v );

//fprintf( pTable, "%d ", Cudd_SharingSize( pRemapped, nOuts ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthSharingMax(dd, pRemapped, nOuts) );


    // perform the encoding
    bFunc = Extra_bddEncodingBinary( dd, pRemapped, nOuts, pbVarsEnc, nVarsEnc );   Cudd_Ref( bFunc );


    // find the cross-manager permutation
    // the variable from the level v in the old manager 
    // should become a variable number v in the new manager
    for ( v = 0; v < nVarsMax + nVarsEnc; v++ )
        Permute[dd->invperm[v]] = v;


    ///////////////////////////////////////////////////////////////////////////////
    // start the new manager
    ddnew = Cudd_Init( nVarsMax + nVarsEnc, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0);
//  Cudd_AutodynDisable(ddnew);
    Cudd_AutodynEnable(dd, CUDD_REORDER_SYMM_SIFT);

    // transfer it to the new manager
    bFuncNew = Cudd_bddTransferPermute( dd, ddnew, bFunc, Permute );      Cudd_Ref( bFuncNew );
    ///////////////////////////////////////////////////////////////////////////////


    // deref the intermediate results in the old manager
    Cudd_RecursiveDeref( dd, bFunc );
    for ( i = 0; i < nOuts; i++ )
        Cudd_RecursiveDeref( dd, pRemapped[i] );


    ///////////////////////////////////////////////////////////////////////////////
    // convert to ADD in the new manager
    aFuncNew = Cudd_BddToAdd( ddnew, bFuncNew );  Cudd_Ref( aFuncNew );
    Cudd_RecursiveDeref( ddnew, bFuncNew );

    // return the manager
    *DdNew = ddnew;
    ///////////////////////////////////////////////////////////////////////////////

    Cudd_Deref( aFuncNew );
    return aFuncNew;
}